

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this;
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  string *this_00;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint uVar7;
  ConstStringParam value;
  Arena *local_80;
  Arena *local_78;
  string temp;
  
  uVar1 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  local_78 = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    local_78 = *(Arena **)local_78;
  }
  uVar1 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  local_80 = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    local_80 = *(Arena **)local_80;
  }
  this = &r->schema_;
  uVar4 = ReflectionSchema::GetFieldOffset(this,field);
  this_00 = (string *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
  uVar4 = ReflectionSchema::GetFieldOffset(this,field);
  value = (ConstStringParam)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
  uVar4 = ReflectionSchema::InlinedStringIndex(this,field);
  puVar5 = Reflection::MutableInlinedStringDonatedArray(r,lhs);
  puVar6 = Reflection::MutableInlinedStringDonatedArray(r,rhs);
  bVar2 = (byte)uVar4 & 0x1f;
  uVar7 = -2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2;
  if (local_78 != local_80) {
    std::__cxx11::string::string((string *)&temp,this_00);
    bVar3 = Reflection::IsInlinedStringDonated(r,lhs,field);
    InlinedStringField::Set
              ((InlinedStringField *)this_00,(string *)0x0,value,local_78,bVar3,
               puVar5 + (uVar4 >> 5),uVar7);
    bVar3 = Reflection::IsInlinedStringDonated(r,rhs,field);
    InlinedStringField::Set
              ((InlinedStringField *)value,(string *)0x0,&temp,local_80,bVar3,puVar6 + (uVar4 >> 5),
               uVar7);
    std::__cxx11::string::~string((string *)&temp);
    return;
  }
  Reflection::IsInlinedStringDonated(r,lhs,field);
  Reflection::IsInlinedStringDonated(r,rhs,field);
  std::__cxx11::string::swap(this_00);
  return;
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArenaForAllocation();
  Arena* rhs_arena = rhs->GetArenaForAllocation();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  const uint32 index = r->schema_.InlinedStringIndex(field);
  uint32* lhs_state = &r->MutableInlinedStringDonatedArray(lhs)[index / 32];
  uint32* rhs_state = &r->MutableInlinedStringDonatedArray(rhs)[index / 32];
  const uint32 mask = ~(static_cast<uint32>(1) << (index % 32));
  if (unsafe_shallow_swap || lhs_arena == rhs_arena) {
    lhs_string->Swap(rhs_string, /*default_value=*/nullptr, lhs_arena,
                     r->IsInlinedStringDonated(*lhs, field),
                     r->IsInlinedStringDonated(*rhs, field),
                     /*donating_states=*/lhs_state, rhs_state, mask);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(nullptr, rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask);
    rhs_string->Set(nullptr, temp, rhs_arena,
                    r->IsInlinedStringDonated(*rhs, field), rhs_state, mask);
  }
}